

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

bool __thiscall
ctemplate::VariableTemplateNode::Expand
          (VariableTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  bool bVar1;
  TemplateAnnotator *pTVar2;
  vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_> *modifiers;
  TemplateString value;
  string local_50;
  
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar2 = PerExpandData::annotator(per_expand_data);
    TemplateToken::ToString_abi_cxx11_(&local_50,&this->token_);
    (*pTVar2->_vptr_TemplateAnnotator[8])(pTVar2,output_buffer,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  (*dictionary->_vptr_TemplateDictionaryInterface[2])(&local_50,dictionary,&this->variable_);
  modifiers = &(this->token_).modvals;
  bVar1 = AnyMightModify(modifiers,per_expand_data);
  if (bVar1) {
    EmitModifiedString(modifiers,local_50._M_dataplus._M_p,local_50._M_string_length,per_expand_data
                       ,output_buffer);
  }
  else {
    (*output_buffer->_vptr_ExpandEmitter[5])(output_buffer);
  }
  if (per_expand_data->annotate_path_ != (char *)0x0) {
    pTVar2 = PerExpandData::annotator(per_expand_data);
    (*pTVar2->_vptr_TemplateAnnotator[9])(pTVar2,output_buffer);
  }
  return true;
}

Assistant:

bool VariableTemplateNode::Expand(ExpandEmitter *output_buffer,
                                  const TemplateDictionaryInterface *dictionary,
                                  PerExpandData* per_expand_data,
                                  const TemplateCache *cache) const {
  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitOpenVariable(output_buffer,
                                                   token_.ToString());
  }

  const TemplateString value = dictionary->GetValue(variable_);

  if (AnyMightModify(token_.modvals, per_expand_data)) {
    EmitModifiedString(token_.modvals, value.data(), value.size(),
                       per_expand_data, output_buffer);
  } else {
    // No need to modify value, so just emit it.
    output_buffer->Emit(value.data(), value.size());
  }

  if (per_expand_data->annotate()) {
    per_expand_data->annotator()->EmitCloseVariable(output_buffer);
  }

  return true;
}